

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.c++
# Opt level: O2

Request<capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionParams,_capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionResults>
* __thiscall
capnproto_test::capnp::test::TestMoreStuff::Client::throwExceptionRequest
          (Request<capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionParams,_capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionResults>
           *__return_storage_ptr__,Client *this,Maybe<capnp::MessageSize> *sizeHint)

{
  Maybe<capnp::MessageSize> local_20;
  
  local_20.ptr.isSet = (sizeHint->ptr).isSet;
  if (local_20.ptr.isSet == true) {
    local_20.ptr.field_1.value.wordCount = (sizeHint->ptr).field_1.value.wordCount;
    local_20.ptr.field_1._8_8_ = *(undefined8 *)((long)&(sizeHint->ptr).field_1 + 8);
  }
  ::capnp::Capability::Client::
  newCall<capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionParams,capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionResults>
            (__return_storage_ptr__,(Client *)(&this->field_0x0 + *(long *)(*(long *)this + -0x18)),
             0xddc70bf9784133cf,0xe,&local_20,(CallHints)0x1);
  return __return_storage_ptr__;
}

Assistant:

::capnp::Request< ::capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionParams,  ::capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionResults>
TestMoreStuff::Client::throwExceptionRequest(::kj::Maybe< ::capnp::MessageSize> sizeHint) {
  return newCall< ::capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionParams,  ::capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionResults>(
      0xddc70bf9784133cfull, 14, sizeHint, {true});
}